

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

string * __thiscall
soul::SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
          (string *__return_storage_ptr__,SourceCodeUtilities *this,Comment *summary)

{
  bool bVar1;
  char *separator;
  string_view t;
  string_view s;
  allocator<char> local_c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_a8;
  string local_88;
  string firstLine;
  string local_48;
  
  if ((*this == (SourceCodeUtilities)0x1) && (*(string **)(this + 8) != *(string **)(this + 0x10)))
  {
    std::__cxx11::string::string((string *)&local_48,*(string **)(this + 8));
    choc::text::trim(&firstLine,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_88,(string *)&firstLine);
    toLowerCase(&local_a8,&local_88);
    t._M_str = local_a8._M_dataplus._M_p;
    t._M_len = local_a8._M_string_length;
    s._M_str = "title:";
    s._M_len = 6;
    separator = "title:";
    bVar1 = choc::text::startsWith(t,s);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&lines,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(this + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&lines,(const_iterator)
                     lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      while ((lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish &&
             ((lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&lines,(const_iterator)
                       lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"\n",&local_c1);
      joinStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,(soul *)&lines,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,(string *)separator);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      std::__cxx11::string::~string((string *)&firstLine);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)&firstLine);
  }
  CodeLocationRange::toString_abi_cxx11_(__return_storage_ptr__,(CodeLocationRange *)(this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeUtilities::getFileSummaryBody (const Comment& summary)
{
    if (summary.valid && ! summary.lines.empty())
    {
        auto firstLine = choc::text::trim (summary.lines[0]);

        if (choc::text::startsWith (toLowerCase (firstLine), "title:"))
        {
            auto lines = summary.lines;
            lines.erase (lines.begin());

            while (! lines.empty() && lines.front().empty())
                lines.erase (lines.begin());

            return joinStrings (lines, "\n");
        }
    }

    return summary.range.toString();
}